

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  long *in_RDX;
  long *in_RSI;
  binary_op_add *this;
  long *in_RDI;
  bool bVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  __m128 afVar14;
  __m128 _outp_2;
  __m128 _p1_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p1_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p1;
  __m512 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_add op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  __m256 *in_stack_fffffffffffff900;
  __m256 *in_stack_fffffffffffff908;
  binary_op_add *in_stack_fffffffffffff910;
  Allocator *in_stack_fffffffffffff918;
  Mat *in_stack_fffffffffffff920;
  Mat *in_stack_fffffffffffff928;
  __m512 *x;
  float local_640 [2];
  float afStack_638 [2];
  float local_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  int local_4cc;
  float local_4c8 [8];
  long local_4a8;
  float local_4a0;
  float local_49c;
  float local_498;
  float local_494;
  float local_490;
  undefined8 local_488;
  binary_op_add *local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined4 local_460;
  long local_458;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined8 local_438;
  float *local_430;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined4 local_400;
  long local_3f8;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  float *local_3d0;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  binary_op_add local_3a9 [9];
  long *local_3a0;
  long *local_398;
  long *local_390;
  int local_384;
  long *local_380;
  undefined1 local_375;
  int local_374;
  undefined8 *local_368;
  undefined1 local_35d;
  int local_35c;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_328;
  undefined8 *local_318;
  __m512 *local_308;
  undefined1 local_2f5;
  int local_2f4;
  float *local_2e8;
  float *local_2d8;
  float *local_2d0;
  float *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  binary_op_add *local_278;
  float *local_270;
  float *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  binary_op_add *local_238;
  float *local_230;
  float *local_228;
  undefined8 local_220;
  float afStack_218 [2];
  binary_op_add *local_210;
  long *local_208;
  long local_200;
  undefined4 local_1f4;
  long local_1f0;
  binary_op_add *local_1e8;
  undefined4 local_1dc;
  int local_1d8;
  int local_1d4;
  float *local_1d0;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  float *local_1b0;
  undefined4 local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  long local_190;
  undefined4 local_184;
  long local_180;
  float *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 local_134;
  long local_130;
  __m512 *local_100;
  undefined8 *local_e0;
  undefined8 *local_c0;
  
  local_3b0 = *(int *)((long)in_RDI + 0x2c);
  local_3b4 = (int)in_RDI[6];
  local_3b8 = *(int *)((long)in_RDI + 0x34);
  local_3bc = (int)in_RDI[7];
  local_3c0 = (int)in_RDI[3];
  local_3c4 = local_3b0 * local_3b4 * local_3b8 * local_3c0;
  local_3a0 = in_RDX;
  local_398 = in_RSI;
  local_390 = in_RDI;
  Mat::create_like(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  local_380 = local_3a0;
  bVar4 = true;
  if (*local_3a0 != 0) {
    local_208 = local_3a0;
    bVar4 = local_3a0[8] * (long)(int)local_3a0[7] == 0;
  }
  if (bVar4) {
    local_384 = -100;
  }
  else {
    for (local_3c8 = 0; local_3c8 < local_3bc; local_3c8 = local_3c8 + 1) {
      local_350 = &local_418;
      local_19c = *(int *)((long)local_390 + 0x2c);
      local_1a0 = (int)local_390[6];
      local_1a4 = *(undefined4 *)((long)local_390 + 0x34);
      local_3d0 = (float *)(*local_390 + local_390[8] * (long)local_3c8 * local_390[2]);
      local_1b8 = local_390[2];
      local_1bc = (undefined4)local_390[3];
      local_1c8 = local_390[4];
      local_198 = &local_418;
      local_140 = (long)local_19c * (long)local_1a0 * local_1b8;
      local_340 = &local_418;
      local_328 = &local_418;
      local_368 = &local_478;
      local_164 = *(int *)((long)local_398 + 0x2c);
      local_168 = (int)local_398[6];
      local_16c = *(undefined4 *)((long)local_398 + 0x34);
      local_430 = (float *)(*local_398 + local_398[8] * (long)local_3c8 * local_398[2]);
      local_180 = local_398[2];
      local_184 = (undefined4)local_398[3];
      local_190 = local_398[4];
      local_160 = &local_478;
      local_150 = (long)local_164 * (long)local_168 * local_180;
      local_348 = &local_478;
      local_318 = &local_478;
      local_2e8 = local_4c8;
      local_1d4 = *(int *)((long)local_3a0 + 0x2c);
      local_1d8 = (int)local_3a0[6];
      local_1dc = *(undefined4 *)((long)local_3a0 + 0x34);
      this = (binary_op_add *)(*local_3a0 + local_3a0[8] * (long)local_3c8 * local_3a0[2]);
      local_1f0 = local_3a0[2];
      local_1f4 = (undefined4)local_3a0[3];
      local_200 = local_3a0[4];
      local_1d0 = local_4c8;
      local_130 = (long)local_1d4 * (long)local_1d8 * local_1f0;
      local_2d8 = local_4c8;
      x = (__m512 *)local_4c8;
      local_3e0 = 0;
      local_3e4 = 0;
      local_3e8 = 0;
      local_3ec = 0;
      local_400 = 0;
      local_408 = 0;
      local_410 = 0;
      local_418 = 0;
      local_440 = 0;
      local_444 = 0;
      local_448 = 0;
      local_44c = 0;
      local_460 = 0;
      local_468 = 0;
      local_470 = 0;
      local_478 = 0;
      local_134 = 0x10;
      local_144 = 0x10;
      local_154 = 0x10;
      local_2f4 = local_3c8;
      local_2f5 = 1;
      local_35c = local_3c8;
      local_35d = 1;
      local_374 = local_3c8;
      local_375 = 1;
      local_3d8 = 0;
      local_3f0 = 0;
      local_438 = 0;
      local_450 = 0;
      local_4c8[0] = 0.0;
      local_4c8[1] = 0.0;
      local_4c8[4] = 0.0;
      local_4c8[5] = 0.0;
      local_4c8[6] = 0.0;
      local_4a0 = 0.0;
      local_49c = 0.0;
      local_498 = 0.0;
      local_494 = 0.0;
      local_490 = 0.0;
      local_488 = 0;
      local_4c8[2] = 0.0;
      local_4c8[3] = 0.0;
      local_480 = this;
      local_308 = x;
      local_1e8 = this;
      local_1b0 = local_3d0;
      local_178 = local_430;
      local_100 = x;
      local_e0 = local_318;
      local_c0 = local_328;
      local_4a8 = local_200;
      local_458 = local_190;
      local_3f8 = local_1c8;
      for (local_4cc = 0; local_4cc + 0xf < local_3c4; local_4cc = local_4cc + 0x10) {
        local_2c8 = local_3d0;
        local_540 = *(undefined8 *)local_3d0;
        uStack_538 = *(undefined8 *)(local_3d0 + 2);
        uStack_530 = *(undefined8 *)(local_3d0 + 4);
        uStack_528 = *(undefined8 *)(local_3d0 + 6);
        uStack_520 = *(undefined8 *)(local_3d0 + 8);
        uStack_518 = *(undefined8 *)(local_3d0 + 10);
        uStack_510 = *(undefined8 *)(local_3d0 + 0xc);
        uStack_508 = *(undefined8 *)(local_3d0 + 0xe);
        local_2d0 = local_430;
        uVar7 = *(undefined8 *)local_430;
        uVar6 = *(undefined8 *)(local_430 + 2);
        uVar8 = *(undefined8 *)(local_430 + 4);
        uVar9 = *(undefined8 *)(local_430 + 6);
        uVar10 = *(undefined8 *)(local_430 + 8);
        uVar11 = *(undefined8 *)(local_430 + 10);
        uVar12 = *(undefined8 *)(local_430 + 0xc);
        uVar13 = *(undefined8 *)(local_430 + 0xe);
        local_580 = uVar7;
        uStack_578 = uVar6;
        uStack_570 = uVar8;
        uStack_568 = uVar9;
        uStack_560 = uVar10;
        uStack_558 = uVar11;
        uStack_550 = uVar12;
        uStack_548 = uVar13;
        BinaryOp_x86_avx512_functor::binary_op_add::func_pack16
                  (this,x,(__m512 *)in_stack_fffffffffffff920);
        local_278 = local_480;
        auVar1._8_8_ = uVar6;
        auVar1._0_8_ = uVar7;
        auVar1._16_8_ = uVar8;
        auVar1._24_8_ = uVar9;
        auVar1._32_8_ = uVar10;
        auVar1._40_8_ = uVar11;
        auVar1._48_8_ = uVar12;
        auVar1._56_8_ = uVar13;
        *(undefined1 (*) [64])local_480 = auVar1;
        local_3d0 = local_3d0 + 0x10;
        local_430 = local_430 + 0x10;
        local_480 = local_480 + 0x40;
        local_5c0 = uVar7;
        uStack_5b8 = uVar6;
        uStack_5b0 = uVar8;
        uStack_5a8 = uVar9;
        uStack_5a0 = uVar10;
        uStack_598 = uVar11;
        uStack_590 = uVar12;
        uStack_588 = uVar13;
        local_2c0 = uVar7;
        uStack_2b8 = uVar6;
        uStack_2b0 = uVar8;
        uStack_2a8 = uVar9;
        uStack_2a0 = uVar10;
        uStack_298 = uVar11;
        uStack_290 = uVar12;
        uStack_288 = uVar13;
      }
      for (; local_4cc + 7 < local_3c4; local_4cc = local_4cc + 8) {
        local_268 = local_3d0;
        local_5e0 = *(undefined8 *)local_3d0;
        uStack_5d8 = *(undefined8 *)(local_3d0 + 2);
        uStack_5d0 = *(undefined8 *)(local_3d0 + 4);
        uStack_5c8 = *(undefined8 *)(local_3d0 + 6);
        local_270 = local_430;
        uVar7 = *(undefined8 *)local_430;
        uVar6 = *(undefined8 *)(local_430 + 2);
        uVar8 = *(undefined8 *)(local_430 + 4);
        uVar9 = *(undefined8 *)(local_430 + 6);
        local_600 = uVar7;
        uStack_5f8 = uVar6;
        uStack_5f0 = uVar8;
        uStack_5e8 = uVar9;
        BinaryOp_x86_avx512_functor::binary_op_add::func_pack8
                  (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
        local_238 = local_480;
        auVar2._8_8_ = uVar6;
        auVar2._0_8_ = uVar7;
        auVar2._16_8_ = uVar8;
        auVar2._24_8_ = uVar9;
        *(undefined1 (*) [32])local_480 = auVar2;
        local_3d0 = local_3d0 + 8;
        local_430 = local_430 + 8;
        local_480 = local_480 + 0x20;
        local_620 = uVar7;
        uStack_618 = uVar6;
        uStack_610 = uVar8;
        uStack_608 = uVar9;
        local_260 = uVar7;
        uStack_258 = uVar6;
        uStack_250 = uVar8;
        uStack_248 = uVar9;
      }
      for (; local_4cc + 3 < local_3c4; local_4cc = local_4cc + 4) {
        local_228 = local_3d0;
        local_630 = *(float (*) [2])local_3d0;
        afStack_628 = *(float (*) [2])(local_3d0 + 2);
        local_230 = local_430;
        local_640 = *(float (*) [2])local_430;
        uVar7 = *(undefined8 *)(local_430 + 2);
        afStack_638 = (float  [2])uVar7;
        afVar14 = BinaryOp_x86_avx512_functor::binary_op_add::func_pack4
                            (local_3a9,(__m128 *)local_630,(__m128 *)local_640);
        local_220 = afVar14._0_8_;
        local_210 = local_480;
        auVar3._8_4_ = (float)uVar7;
        auVar3._12_4_ = SUB84(uVar7,4);
        auVar3._0_8_ = local_220;
        *(undefined1 (*) [16])local_480 = auVar3;
        local_3d0 = local_3d0 + 4;
        local_430 = local_430 + 4;
        local_480 = local_480 + 0x10;
        afStack_218 = (float  [2])uVar7;
      }
      for (; local_4cc < local_3c4; local_4cc = local_4cc + 1) {
        fVar5 = BinaryOp_x86_avx512_functor::binary_op_add::func(local_3a9,local_3d0,local_430);
        *(float *)local_480 = fVar5;
        local_3d0 = local_3d0 + 1;
        local_430 = local_430 + 1;
        local_480 = local_480 + 4;
      }
    }
    local_384 = 0;
  }
  return local_384;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}